

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

void ntru_mod3(uint16_t *out,uint16_t *in,uint p,uint q)

{
  short sVar1;
  ulong uVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  if (p != 0) {
    uVar5 = (q >> 1) - 1;
    iVar4 = uVar5 + (uint)(ushort)((ulong)uVar5 * 0x555555555555 >> 0x30) * -3;
    uVar2 = 0;
    do {
      uVar5 = (uint)in[uVar2] + (q >> 1);
      iVar6 = uVar5 - (uint)(ushort)(SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x1000000000000)) /
                                            ZEXT416(q & 0xffff),0) * (ulong)uVar5 >> 0x30) *
                      (q & 0xffff);
      uVar5 = q;
      if ((short)((short)iVar6 - (short)q) < 0) {
        uVar5 = 0;
      }
      uVar5 = (iVar6 - uVar5 & 0xffff) +
              (((uint)(-1 < (short)((short)iVar4 + -3)) * 3 - iVar4) + 3 & 0xffff);
      sVar1 = (short)uVar5 + (short)((ulong)uVar5 * 0x555555555555 >> 0x30) * -3;
      sVar3 = sVar1 + -3;
      if ((short)(sVar1 + -3) < 0) {
        sVar3 = sVar1;
      }
      out[uVar2] = sVar3 - 1;
      uVar2 = uVar2 + 1;
    } while (p != uVar2);
  }
  return;
}

Assistant:

void ntru_mod3(uint16_t *out, const uint16_t *in, unsigned p, unsigned q)
{
    uint64_t qrecip = reciprocal_for_reduction(q);
    uint64_t recip3 = reciprocal_for_reduction(3);

    unsigned bias = q/2;
    uint16_t adjust = 3 - reduce(bias-1, 3, recip3);

    for (unsigned i = 0; i < p; i++) {
        uint16_t val = reduce(in[i] + bias, q, qrecip);
        uint16_t residue = reduce(val + adjust, 3, recip3);
        out[i] = residue - 1;
    }
}